

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcd.cpp
# Opt level: O3

ssize_t __thiscall GPIO::HitachiLCD::write(HitachiLCD *this,int __fd,void *__buf,size_t __n)

{
  RecursiveMutex *__mutex;
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  long lVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  wstring *__range1;
  long lVar6;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,__fd);
  __mutex = &this->recursivemutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    lVar6 = plVar5[1];
    if (lVar6 == 0) {
      lVar6 = 0;
    }
    else {
      lVar1 = *plVar5;
      lVar4 = 0;
      __buf_00 = extraout_RDX;
      do {
        write(this,*(int *)(lVar1 + lVar4),__buf_00,__n);
        lVar4 = lVar4 + 4;
        __buf_00 = extraout_RDX_00;
      } while (lVar6 << 2 != lVar4);
      lVar6 = plVar5[1];
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return lVar6;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

std::size_t HitachiLCD::write(const std::wstring& ws)
{
    RecursiveLock rlock(recursivemutex);
    for (auto ch : ws) write(ch);
    return ws.size();
}